

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::ProgramPipelines::FunctionalTest::preparePipeline(FunctionalTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 *puVar4;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_ppo == 0) {
    (**(code **)(lVar3 + 0x3d0))(1,&this->m_ppo);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glCreateProgramPipelines call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                    ,0x2c3);
    (**(code **)(lVar3 + 0x98))(this->m_ppo);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBindProgramPipeline call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                    ,0x2c6);
    (**(code **)(lVar3 + 0x1688))(this->m_ppo,1,this->m_spo_v);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glUseProgramStages call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                    ,0x2c9);
    (**(code **)(lVar3 + 0x1688))(this->m_ppo,2,this->m_spo_f);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glUseProgramStages call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                    ,0x2cc);
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

void FunctionalTest::preparePipeline()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Sanity check. */
	if (m_ppo)
	{
		throw 0;
	}

	/* Create, use and set up program pipeline. */
	gl.createProgramPipelines(1, &m_ppo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgramPipelines call failed.");

	gl.bindProgramPipeline(m_ppo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline call failed.");

	gl.useProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_spo_v);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages call failed.");

	gl.useProgramStages(m_ppo, GL_FRAGMENT_SHADER_BIT, m_spo_f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages call failed.");
}